

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

void gaminv(double *a,double *x,double *x0,double *p,double *q,int *ierr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int *ierr_local;
  double *q_local;
  double *p_local;
  double *x0_local;
  double *x_local;
  double *a_local;
  
  gaminv::e = spmpar(&gaminv::K1);
  gaminv::xmin = spmpar(&gaminv::K2);
  gaminv::xmax = spmpar(&gaminv::K3);
  *x = 0.0;
  if (*a <= 0.0) {
    *ierr = -2;
    return;
  }
  gaminv::t = (*p + *q) - 1.0;
  if (gaminv::e < ABS(gaminv::t)) {
    *ierr = -4;
    return;
  }
  *ierr = 0;
  if ((*p == 0.0) && (!NAN(*p))) {
    return;
  }
  if ((*q == 0.0) && (!NAN(*q))) {
    *x = gaminv::xmax;
    return;
  }
  if ((*a == 1.0) && (!NAN(*a))) {
    if (*q <= 0.9 && *q != 0.9) {
      dVar6 = log(*q);
      *x = -dVar6;
      return;
    }
    gaminv::T9 = -*p;
    dVar6 = alnrel(&gaminv::T9);
    *x = -dVar6;
    return;
  }
  gaminv::e2 = gaminv::e * 2.0;
  gaminv::amax = 4e-11 / (gaminv::e * gaminv::e);
  gaminv::iop = 1;
  if (1e-10 < gaminv::e) {
    gaminv::iop = 2;
  }
  gaminv::eps = gaminv::eps0[gaminv::iop + -1];
  gaminv::xn = *x0;
  if (*x0 <= 0.0) {
    if (*a <= 1.0) {
      gaminv::T4 = *a + 1.0;
      gaminv::g = Xgamm(&gaminv::T4);
      gaminv::qg = *q * gaminv::g;
      if ((gaminv::qg == 0.0) && (!NAN(gaminv::qg))) {
LAB_0011186e:
        *x = gaminv::xmax;
        *ierr = -8;
        return;
      }
      gaminv::b = gaminv::qg / *a;
      if (gaminv::qg <= *a * 0.6) {
        if ((*a < 0.3) && (0.35 <= gaminv::b)) {
          dVar5 = exp(-(gaminv::b + gaminv::c));
          gaminv::t = dVar5;
          dVar1 = exp(dVar5);
          dVar6 = gaminv::t;
          gaminv::u = dVar5 * dVar1;
          dVar5 = exp(gaminv::u);
          gaminv::xn = dVar6 * dVar5;
          goto LAB_00111021;
        }
        if (gaminv::b < 0.45) {
          if ((gaminv::b == 0.0) && (!NAN(gaminv::b))) goto LAB_0011186e;
          dVar6 = log(gaminv::b);
          gaminv::y = -dVar6;
          gaminv::s = (0.5 - *a) + 0.5;
          gaminv::z = log(gaminv::y);
          dVar5 = gaminv::y;
          dVar6 = gaminv::s;
          gaminv::t = -gaminv::s * gaminv::z + gaminv::y;
          if (0.15 <= gaminv::b) {
            dVar1 = log(gaminv::t);
            dVar2 = log(gaminv::s / (gaminv::t + 1.0) + 1.0);
            gaminv::xn = (-dVar6 * dVar1 + dVar5) - dVar2;
          }
          else {
            if (gaminv::b <= 0.01) goto LAB_0011001e;
            gaminv::u = (((3.0 - *a) + (3.0 - *a) + gaminv::t) * gaminv::t + (2.0 - *a) * (3.0 - *a)
                        ) / ((gaminv::t + (5.0 - *a)) * gaminv::t + 2.0);
            dVar1 = log(gaminv::t);
            dVar2 = log(gaminv::u);
            gaminv::xn = (-dVar6 * dVar1 + dVar5) - dVar2;
          }
          goto LAB_001113d3;
        }
      }
      if (gaminv::b * *q <= 1e-08) {
        gaminv::xn = exp(-(*q / *a + gaminv::c));
      }
      else if (0.9 < *p) {
        gaminv::T5 = -*q;
        dVar6 = alnrel(&gaminv::T5);
        dVar5 = gamln1(a);
        gaminv::xn = exp((dVar6 + dVar5) / *a);
      }
      else {
        dVar6 = log(*p * gaminv::g);
        gaminv::xn = exp(dVar6 / *a);
      }
      if ((gaminv::xn == 0.0) && (!NAN(gaminv::xn))) {
        *ierr = -3;
        return;
      }
      gaminv::t = (0.5 - gaminv::xn / (*a + 1.0)) + 0.5;
      gaminv::xn = gaminv::xn / gaminv::t;
      goto LAB_00111021;
    }
    if (0.5 < *q) {
      gaminv::w = log(*p);
    }
    else {
      gaminv::w = log(*q);
    }
    gaminv::t = sqrt(-(gaminv::w * 2.0));
    gaminv::s = gaminv::t -
                (((gaminv::a3 * gaminv::t + gaminv::a2) * gaminv::t + gaminv::a1) * gaminv::t +
                gaminv::a0) /
                ((((gaminv::b4 * gaminv::t + gaminv::b3) * gaminv::t + gaminv::b2) * gaminv::t +
                 gaminv::b1) * gaminv::t + 1.0);
    if (0.5 < *q) {
      gaminv::s = -gaminv::s;
    }
    gaminv::rta = sqrt(*a);
    gaminv::s2 = gaminv::s * gaminv::s;
    gaminv::xn = ((gaminv::s * gaminv::rta + *a + (gaminv::s2 - 1.0) / 3.0 +
                  (gaminv::s * (gaminv::s2 - 7.0)) / (gaminv::rta * 36.0)) -
                 ((gaminv::s2 * 3.0 + 7.0) * gaminv::s2 + -16.0) / (*a * 810.0)) +
                 (gaminv::s * ((gaminv::s2 * 9.0 + 256.0) * gaminv::s2 + -433.0)) /
                 (*a * 38880.0 * gaminv::rta);
    gaminv::xn = fifdmax1(gaminv::xn,0.0);
    if (gaminv::amin[gaminv::iop + -1] <= *a) {
      *x = gaminv::xn;
      gaminv::d = (0.5 - *x / *a) + 0.5;
      if (ABS(gaminv::d) <= gaminv::dmin[gaminv::iop + -1]) {
        return;
      }
    }
    dVar6 = gaminv::w;
    if (*p <= 0.5) {
      gaminv::ap1 = *a + 1.0;
      if (gaminv::xn <= gaminv::ap1 * 0.7) {
        dVar6 = gamln(&gaminv::ap1);
        gaminv::w = dVar6 + gaminv::w;
        if (gaminv::xn <= gaminv::ap1 * 0.15) {
          gaminv::ap2 = *a + 2.0;
          gaminv::ap3 = *a + 3.0;
          dVar6 = exp((gaminv::w + *x) / *a);
          *x = dVar6;
          dVar6 = gaminv::w + *x;
          dVar5 = log((*x / gaminv::ap1) * (*x / gaminv::ap2 + 1.0) + 1.0);
          dVar6 = exp((dVar6 - dVar5) / *a);
          *x = dVar6;
          dVar6 = gaminv::w + *x;
          dVar5 = log((*x / gaminv::ap1) * (*x / gaminv::ap2 + 1.0) + 1.0);
          dVar6 = exp((dVar6 - dVar5) / *a);
          *x = dVar6;
          dVar6 = gaminv::w + *x;
          dVar5 = log((*x / gaminv::ap1) * ((*x / gaminv::ap2) * (*x / gaminv::ap3 + 1.0) + 1.0) +
                      1.0);
          dVar6 = exp((dVar6 - dVar5) / *a);
          *x = dVar6;
          gaminv::xn = *x;
          if (gaminv::xn <= gaminv::ap1 * 0.01) {
            if (gaminv::xn <= gaminv::emin[gaminv::iop + -1] * gaminv::ap1) {
              return;
            }
            goto LAB_0011103e;
          }
        }
        dVar6 = gaminv::w;
        gaminv::apn = gaminv::ap1;
        gaminv::t = gaminv::xn / gaminv::ap1;
        gaminv::sum = gaminv::t + 1.0;
        do {
          gaminv::apn = gaminv::apn + 1.0;
          gaminv::t = (gaminv::xn / gaminv::apn) * gaminv::t;
          gaminv::sum = gaminv::t + gaminv::sum;
        } while (0.0001 < gaminv::t);
        dVar5 = log(gaminv::sum);
        gaminv::t = dVar6 - dVar5;
        gaminv::xn = exp((gaminv::xn + gaminv::t) / *a);
        dVar6 = *a;
        dVar5 = log(gaminv::xn);
        gaminv::xn = (1.0 - ((dVar6 * dVar5 + -gaminv::xn) - gaminv::t) / (*a - gaminv::xn)) *
                     gaminv::xn;
      }
      goto LAB_0011103e;
    }
    if (*a * 3.0 <= gaminv::xn) {
      dVar5 = gamln(a);
      gaminv::y = -(dVar6 + dVar5);
      gaminv::d = fifdmax1(2.0,*a * (*a - 1.0));
      dVar6 = gaminv::y;
      if (gaminv::ln10 * gaminv::d <= gaminv::y) {
        gaminv::s = 1.0 - *a;
        gaminv::z = log(gaminv::y);
LAB_0011001e:
        gaminv::c1 = -(gaminv::s * gaminv::z);
        gaminv::c2 = -(gaminv::s * (gaminv::c1 + 1.0));
        gaminv::c3 = gaminv::s * ((gaminv::c1 * 0.5 + (2.0 - *a)) * gaminv::c1 + *a * -1.5 + 2.5);
        gaminv::c4 = -(gaminv::s *
                      (((gaminv::c1 / 3.0 + *a * -1.5 + 2.5) * gaminv::c1 + (*a - 6.0) * *a + 7.0) *
                       gaminv::c1 + ((*a * 11.0 + -46.0) * *a + 47.0) / 6.0));
        gaminv::c5 = -(gaminv::s *
                      ((((-(gaminv::c1 / 4.0) + (*a * 11.0 + -17.0) / 6.0) * gaminv::c1 +
                        (*a * -3.0 + 13.0) * *a + -13.0) * gaminv::c1 +
                       (((*a + *a + -25.0) * *a + 72.0) * *a + -61.0) * 0.5) * gaminv::c1 +
                      (((*a * 25.0 + -195.0) * *a + 477.0) * *a + -379.0) / 12.0));
        gaminv::xn = (((gaminv::c5 / gaminv::y + gaminv::c4) / gaminv::y + gaminv::c3) / gaminv::y +
                     gaminv::c2) / gaminv::y + gaminv::c1 + gaminv::y;
        if ((*a <= 1.0) &&
           (gaminv::b < gaminv::bmin[gaminv::iop + -1] ||
            gaminv::b == gaminv::bmin[gaminv::iop + -1])) {
          *x = gaminv::xn;
          return;
        }
      }
      else {
        dVar2 = *a - 1.0;
        gaminv::T6 = -(dVar2 / (gaminv::xn + 1.0));
        gaminv::t = dVar2;
        dVar3 = log(gaminv::xn);
        dVar4 = alnrel(&gaminv::T6);
        dVar1 = gaminv::y;
        dVar5 = gaminv::t;
        gaminv::xn = (dVar2 * dVar3 + dVar6) - dVar4;
        gaminv::T7 = -(gaminv::t / (gaminv::xn + 1.0));
        dVar6 = log(gaminv::xn);
        dVar2 = alnrel(&gaminv::T7);
        gaminv::xn = (dVar5 * dVar6 + dVar1) - dVar2;
      }
    }
  }
  else {
LAB_00111021:
    if (*p <= 0.5) {
LAB_0011103e:
      if (gaminv::xmin * 10000000000.0 < *p) {
        gaminv::am1 = (*a - 0.5) - 0.5;
        while ((*a <= gaminv::amax ||
               (gaminv::d = (0.5 - gaminv::xn / *a) + 0.5, gaminv::e2 < ABS(gaminv::d)))) {
          if (0x13 < *ierr) goto LAB_0011183a;
          *ierr = *ierr + 1;
          gratio(a,&gaminv::xn,&gaminv::pn,&gaminv::qn,&gaminv::K8);
          if (((gaminv::pn == 0.0) && (!NAN(gaminv::pn))) ||
             ((gaminv::qn == 0.0 && (!NAN(gaminv::qn))))) break;
          gaminv::r = rcomp(a,&gaminv::xn);
          if ((gaminv::r == 0.0) && (!NAN(gaminv::r))) break;
          gaminv::t = (gaminv::pn - *p) / gaminv::r;
          gaminv::w = (gaminv::am1 - gaminv::xn) * 0.5;
          if ((0.1 < ABS(gaminv::t)) || (0.1 < ABS(gaminv::w * gaminv::t))) {
            *x = gaminv::xn * (1.0 - gaminv::t);
            dVar6 = gaminv::t;
            if (*x <= 0.0) goto LAB_00111846;
          }
          else {
            gaminv::h = gaminv::t * (gaminv::w * gaminv::t + 1.0);
            *x = gaminv::xn * (1.0 - gaminv::h);
            if (*x <= 0.0) goto LAB_00111846;
            dVar6 = gaminv::h;
            if ((1.0 <= ABS(gaminv::w)) && (ABS(gaminv::w) * gaminv::t * gaminv::t <= gaminv::eps))
            {
              return;
            }
          }
          gaminv::d = ABS(dVar6);
          gaminv::xn = *x;
          if (gaminv::d <= gaminv::tol) {
            if (gaminv::d <= gaminv::eps) {
              return;
            }
            if (ABS(*p - gaminv::pn) <= gaminv::tol * *p) {
              return;
            }
          }
        }
      }
      goto LAB_00111852;
    }
  }
LAB_001113d3:
  if (gaminv::xmin * 10000000000.0 < *q) {
    gaminv::am1 = (*a - 0.5) - 0.5;
    while ((*a <= gaminv::amax ||
           (gaminv::d = (0.5 - gaminv::xn / *a) + 0.5, gaminv::e2 < ABS(gaminv::d)))) {
      if (0x13 < *ierr) {
LAB_0011183a:
        *ierr = -6;
        return;
      }
      *ierr = *ierr + 1;
      gratio(a,&gaminv::xn,&gaminv::pn,&gaminv::qn,&gaminv::K8);
      if (((gaminv::pn == 0.0) && (!NAN(gaminv::pn))) || ((gaminv::qn == 0.0 && (!NAN(gaminv::qn))))
         ) break;
      gaminv::r = rcomp(a,&gaminv::xn);
      if ((gaminv::r == 0.0) && (!NAN(gaminv::r))) break;
      gaminv::t = (*q - gaminv::qn) / gaminv::r;
      gaminv::w = (gaminv::am1 - gaminv::xn) * 0.5;
      if ((0.1 < ABS(gaminv::t)) || (0.1 < ABS(gaminv::w * gaminv::t))) {
        *x = gaminv::xn * (1.0 - gaminv::t);
        dVar6 = gaminv::t;
        if (*x <= 0.0) goto LAB_00111846;
      }
      else {
        gaminv::h = gaminv::t * (gaminv::w * gaminv::t + 1.0);
        *x = gaminv::xn * (1.0 - gaminv::h);
        if (*x <= 0.0) {
LAB_00111846:
          *ierr = -7;
          return;
        }
        dVar6 = gaminv::h;
        if ((1.0 <= ABS(gaminv::w)) && (ABS(gaminv::w) * gaminv::t * gaminv::t <= gaminv::eps)) {
          return;
        }
      }
      gaminv::d = ABS(dVar6);
      gaminv::xn = *x;
      if (gaminv::d <= gaminv::tol) {
        if (gaminv::d <= gaminv::eps) {
          return;
        }
        if (ABS(*q - gaminv::qn) <= gaminv::tol * *q) {
          return;
        }
      }
    }
  }
LAB_00111852:
  *x = gaminv::xn;
  *ierr = -8;
  return;
}

Assistant:

void gaminv(double *a,double *x,double *x0,double *p,double *q,
            int *ierr)
/*
 ----------------------------------------------------------------------
            INVERSE INCOMPLETE GAMMA RATIO FUNCTION

     GIVEN POSITIVE A, AND NONEGATIVE P AND Q WHERE P + Q = 1.
     THEN X IS COMPUTED WHERE P(A,X) = P AND Q(A,X) = Q. SCHRODER
     ITERATION IS EMPLOYED. THE ROUTINE ATTEMPTS TO COMPUTE X
     TO 10 SIGNIFICANT DIGITS IF THIS IS POSSIBLE FOR THE
     PARTICULAR COMPUTER ARITHMETIC BEING USED.

                      ------------

     X IS A VARIABLE. IF P = 0 THEN X IS ASSIGNED THE VALUE 0,
     AND IF Q = 0 THEN X IS SET TO THE LARGEST FLOATING POINT
     NUMBER AVAILABLE. OTHERWISE, GAMINV ATTEMPTS TO OBTAIN
     A SOLUTION FOR P(A,X) = P AND Q(A,X) = Q. IF THE ROUTINE
     IS SUCCESSFUL THEN THE SOLUTION IS STORED IN X.

     X0 IS AN OPTIONAL INITIAL APPROXIMATION FOR X. IF THE USER
     DOES NOT WISH TO SUPPLY AN INITIAL APPROXIMATION, THEN SET
     X0 .LE. 0.

     IERR IS A VARIABLE THAT REPORTS THE STATUS OF THE RESULTS.
     WHEN THE ROUTINE TERMINATES, IERR HAS ONE OF THE FOLLOWING
     VALUES ...

       IERR =  0    THE SOLUTION WAS OBTAINED. ITERATION WAS
                    NOT USED.
       IERR.GT.0    THE SOLUTION WAS OBTAINED. IERR ITERATIONS
                    WERE PERFORMED.
       IERR = -2    (INPUT ERROR) A .LE. 0
       IERR = -3    NO SOLUTION WAS OBTAINED. THE RATIO Q/A
                    IS TOO LARGE.
       IERR = -4    (INPUT ERROR) P + Q .NE. 1
       IERR = -6    20 ITERATIONS WERE PERFORMED. THE MOST
                    RECENT VALUE OBTAINED FOR X IS GIVEN.
                    THIS CANNOT OCCUR IF X0 .LE. 0.
       IERR = -7    ITERATION FAILED. NO VALUE IS GIVEN FOR X.
                    THIS MAY OCCUR WHEN X IS APPROXIMATELY 0.
       IERR = -8    A VALUE FOR X HAS BEEN OBTAINED, BUT THE
                    ROUTINE IS NOT CERTAIN OF ITS ACCURACY.
                    ITERATION CANNOT BE PERFORMED IN THIS
                    CASE. IF X0 .LE. 0, THIS CAN OCCUR ONLY
                    WHEN P OR Q IS APPROXIMATELY 0. IF X0 IS
                    POSITIVE THEN THIS CAN OCCUR WHEN A IS
                    EXCEEDINGLY CLOSE TO X AND A IS EXTREMELY
                    LARGE (SAY A .GE. 1.E20).
 ----------------------------------------------------------------------
     WRITTEN BY ALFRED H. MORRIS, JR.
        NAVAL SURFACE WEAPONS CENTER
        DAHLGREN, VIRGINIA
     -------------------
*/
{
static double a0 = 3.31125922108741e0;
static double a1 = 11.6616720288968e0;
static double a2 = 4.28342155967104e0;
static double a3 = .213623493715853e0;
static double b1 = 6.61053765625462e0;
static double b2 = 6.40691597760039e0;
static double b3 = 1.27364489782223e0;
static double b4 = .036117081018842e0;
static double c = .577215664901533e0;
static double ln10 = 2.302585e0;
static double tol = 1.e-5;
static double amin[2] = {
    500.0e0,100.0e0
};
static double bmin[2] = {
    1.e-28,1.e-13
};
static double dmin[2] = {
    1.e-06,1.e-04
};
static double emin[2] = {
    2.e-03,6.e-03
};
static double eps0[2] = {
    1.e-10,1.e-08
};
static int K1 = 1;
static int K2 = 2;
static int K3 = 3;
static int K8 = 0;
static double am1,amax,ap1,ap2,ap3,apn,b,c1,c2,c3,c4,c5,d,e,e2,eps,g,h,pn,qg,qn,
    r,rta,s,s2,sum,t,u,w,xmax,xmin,xn,y,z;
static int iop;
static double T4,T5,T6,T7,T9;
/*
     ..
     .. Executable Statements ..
*/
/*
     ****** E, XMIN, AND XMAX ARE MACHINE DEPENDENT CONSTANTS.
            E IS THE SMALLEST NUMBER FOR WHICH 1.0 + E .GT. 1.0.
            XMIN IS THE SMALLEST POSITIVE NUMBER AND XMAX IS THE
            LARGEST POSITIVE NUMBER.
*/
    e = spmpar(&K1);
    xmin = spmpar(&K2);
    xmax = spmpar(&K3);
    *x = 0.0e0;
    if(*a <= 0.0e0) goto S300;
    t = *p+*q-1.e0;
    if(fabs(t) > e) goto S320;
    *ierr = 0;
    if(*p == 0.0e0) return;
    if(*q == 0.0e0) goto S270;
    if(*a == 1.0e0) goto S280;
    e2 = 2.0e0*e;
    amax = 0.4e-10/(e*e);
    iop = 1;
    if(e > 1.e-10) iop = 2;
    eps = eps0[iop-1];
    xn = *x0;
    if(*x0 > 0.0e0) goto S160;
/*
        SELECTION OF THE INITIAL APPROXIMATION XN OF X
                       WHEN A .LT. 1
*/
    if(*a > 1.0e0) goto S80;
    T4 = *a+1.0e0;
    g = Xgamm(&T4);
    qg = *q*g;
    if(qg == 0.0e0) goto S360;
    b = qg/ *a;
    if(qg > 0.6e0**a) goto S40;
    if(*a >= 0.30e0 || b < 0.35e0) goto S10;
    t = exp(-(b+c));
    u = t*exp(t);
    xn = t*exp(u);
    goto S160;
S10:
    if(b >= 0.45e0) goto S40;
    if(b == 0.0e0) goto S360;
    y = -log(b);
    s = 0.5e0+(0.5e0-*a);
    z = log(y);
    t = y-s*z;
    if(b < 0.15e0) goto S20;
    xn = y-s*log(t)-log(1.0e0+s/(t+1.0e0));
    goto S220;
S20:
    if(b <= 0.01e0) goto S30;
    u = ((t+2.0e0*(3.0e0-*a))*t+(2.0e0-*a)*(3.0e0-*a))/((t+(5.0e0-*a))*t+2.0e0);
    xn = y-s*log(t)-log(u);
    goto S220;
S30:
    c1 = -(s*z);
    c2 = -(s*(1.0e0+c1));
    c3 = s*((0.5e0*c1+(2.0e0-*a))*c1+(2.5e0-1.5e0**a));
    c4 = -(s*(((c1/3.0e0+(2.5e0-1.5e0**a))*c1+((*a-6.0e0)**a+7.0e0))*c1+(
      (11.0e0**a-46.0)**a+47.0e0)/6.0e0));
    c5 = -(s*((((-(c1/4.0e0)+(11.0e0**a-17.0e0)/6.0e0)*c1+((-(3.0e0**a)+13.0e0)*
      *a-13.0e0))*c1+0.5e0*(((2.0e0**a-25.0e0)**a+72.0e0)**a-61.0e0))*c1+((
      (25.0e0**a-195.0e0)**a+477.0e0)**a-379.0e0)/12.0e0));
    xn = (((c5/y+c4)/y+c3)/y+c2)/y+c1+y;
    if(*a > 1.0e0) goto S220;
    if(b > bmin[iop-1]) goto S220;
    *x = xn;
    return;
S40:
    if(b**q > 1.e-8) goto S50;
    xn = exp(-(*q/ *a+c));
    goto S70;
S50:
    if(*p <= 0.9e0) goto S60;
    T5 = -*q;
    xn = exp((alnrel(&T5)+gamln1(a))/ *a);
    goto S70;
S60:
    xn = exp(log(*p*g)/ *a);
S70:
    if(xn == 0.0e0) goto S310;
    t = 0.5e0+(0.5e0-xn/(*a+1.0e0));
    xn /= t;
    goto S160;
S80:
/*
        SELECTION OF THE INITIAL APPROXIMATION XN OF X
                       WHEN A .GT. 1
*/
    if(*q <= 0.5e0) goto S90;
    w = log(*p);
    goto S100;
S90:
    w = log(*q);
S100:
    t = sqrt(-(2.0e0*w));
    s = t-(((a3*t+a2)*t+a1)*t+a0)/((((b4*t+b3)*t+b2)*t+b1)*t+1.0e0);
    if(*q > 0.5e0) s = -s;
    rta = sqrt(*a);
    s2 = s*s;
    xn = *a+s*rta+(s2-1.0e0)/3.0e0+s*(s2-7.0e0)/(36.0e0*rta)-((3.0e0*s2+7.0e0)*
      s2-16.0e0)/(810.0e0**a)+s*((9.0e0*s2+256.0e0)*s2-433.0e0)/(38880.0e0**a*
      rta);
    xn = fifdmax1(xn,0.0e0);
    if(*a < amin[iop-1]) goto S110;
    *x = xn;
    d = 0.5e0+(0.5e0-*x/ *a);
    if(fabs(d) <= dmin[iop-1]) return;
S110:
    if(*p <= 0.5e0) goto S130;
    if(xn < 3.0e0**a) goto S220;
    y = -(w+gamln(a));
    d = fifdmax1(2.0e0,*a*(*a-1.0e0));
    if(y < ln10*d) goto S120;
    s = 1.0e0-*a;
    z = log(y);
    goto S30;
S120:
    t = *a-1.0e0;
    T6 = -(t/(xn+1.0e0));
    xn = y+t*log(xn)-alnrel(&T6);
    T7 = -(t/(xn+1.0e0));
    xn = y+t*log(xn)-alnrel(&T7);
    goto S220;
S130:
    ap1 = *a+1.0e0;
    if(xn > 0.70e0*ap1) goto S170;
    w += gamln(&ap1);
    if(xn > 0.15e0*ap1) goto S140;
    ap2 = *a+2.0e0;
    ap3 = *a+3.0e0;
    *x = exp((w+*x)/ *a);
    *x = exp((w+*x-log(1.0e0+*x/ap1*(1.0e0+*x/ap2)))/ *a);
    *x = exp((w+*x-log(1.0e0+*x/ap1*(1.0e0+*x/ap2)))/ *a);
    *x = exp((w+*x-log(1.0e0+*x/ap1*(1.0e0+*x/ap2*(1.0e0+*x/ap3))))/ *a);
    xn = *x;
    if(xn > 1.e-2*ap1) goto S140;
    if(xn <= emin[iop-1]*ap1) return;
    goto S170;
S140:
    apn = ap1;
    t = xn/apn;
    sum = 1.0e0+t;
S150:
    apn += 1.0e0;
    t *= (xn/apn);
    sum += t;
    if(t > 1.e-4) goto S150;
    t = w-log(sum);
    xn = exp((xn+t)/ *a);
    xn *= (1.0e0-(*a*log(xn)-xn-t)/(*a-xn));
    goto S170;
S160:
/*
                 SCHRODER ITERATION USING P
*/
    if(*p > 0.5e0) goto S220;
S170:
    if(*p <= 1.e10*xmin) goto S350;
    am1 = *a-0.5e0-0.5e0;
S180:
    if(*a <= amax) goto S190;
    d = 0.5e0+(0.5e0-xn/ *a);
    if(fabs(d) <= e2) goto S350;
S190:
    if(*ierr >= 20) goto S330;
    *ierr += 1;
    gratio(a,&xn,&pn,&qn,&K8);
    if(pn == 0.0e0 || qn == 0.0e0) goto S350;
    r = rcomp(a,&xn);
    if(r == 0.0e0) goto S350;
    t = (pn-*p)/r;
    w = 0.5e0*(am1-xn);
    if(fabs(t) <= 0.1e0 && fabs(w*t) <= 0.1e0) goto S200;
    *x = xn*(1.0e0-t);
    if(*x <= 0.0e0) goto S340;
    d = fabs(t);
    goto S210;
S200:
    h = t*(1.0e0+w*t);
    *x = xn*(1.0e0-h);
    if(*x <= 0.0e0) goto S340;
    if(fabs(w) >= 1.0e0 && fabs(w)*t*t <= eps) return;
    d = fabs(h);
S210:
    xn = *x;
    if(d > tol) goto S180;
    if(d <= eps) return;
    if(fabs(*p-pn) <= tol**p) return;
    goto S180;
S220:
/*
                 SCHRODER ITERATION USING Q
*/
    if(*q <= 1.e10*xmin) goto S350;
    am1 = *a-0.5e0-0.5e0;
S230:
    if(*a <= amax) goto S240;
    d = 0.5e0+(0.5e0-xn/ *a);
    if(fabs(d) <= e2) goto S350;
S240:
    if(*ierr >= 20) goto S330;
    *ierr += 1;
    gratio(a,&xn,&pn,&qn,&K8);
    if(pn == 0.0e0 || qn == 0.0e0) goto S350;
    r = rcomp(a,&xn);
    if(r == 0.0e0) goto S350;
    t = (*q-qn)/r;
    w = 0.5e0*(am1-xn);
    if(fabs(t) <= 0.1e0 && fabs(w*t) <= 0.1e0) goto S250;
    *x = xn*(1.0e0-t);
    if(*x <= 0.0e0) goto S340;
    d = fabs(t);
    goto S260;
S250:
    h = t*(1.0e0+w*t);
    *x = xn*(1.0e0-h);
    if(*x <= 0.0e0) goto S340;
    if(fabs(w) >= 1.0e0 && fabs(w)*t*t <= eps) return;
    d = fabs(h);
S260:
    xn = *x;
    if(d > tol) goto S230;
    if(d <= eps) return;
    if(fabs(*q-qn) <= tol**q) return;
    goto S230;
S270:
/*
                       SPECIAL CASES
*/
    *x = xmax;
    return;
S280:
    if(*q < 0.9e0) goto S290;
    T9 = -*p;
    *x = -alnrel(&T9);
    return;
S290:
    *x = -log(*q);
    return;
S300:
/*
                       ERROR RETURN
*/
    *ierr = -2;
    return;
S310:
    *ierr = -3;
    return;
S320:
    *ierr = -4;
    return;
S330:
    *ierr = -6;
    return;
S340:
    *ierr = -7;
    return;
S350:
    *x = xn;
    *ierr = -8;
    return;
S360:
    *x = xmax;
    *ierr = -8;
    return;
}